

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_bit_encoder.cc
# Opt level: O3

void __thiscall
draco::DirectBitEncoder::EndEncoding(DirectBitEncoder *this,EncoderBuffer *target_buffer)

{
  iterator __position;
  undefined4 in_EAX;
  pointer puVar1;
  uint *puVar2;
  uint32_t size_in_byte;
  undefined8 uStack_18;
  
  __position._M_current =
       (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uStack_18._0_4_ = in_EAX;
  if (__position._M_current ==
      (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)this,__position,
               &this->local_bits_);
    puVar2 = (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = this->local_bits_;
    puVar2 = __position._M_current + 1;
    (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  puVar1 = (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uStack_18 = CONCAT44((int)puVar2 - (int)puVar1,(undefined4)uStack_18) & 0xfffffffcffffffff;
  if (target_buffer->bit_encoder_reserved_bytes_ < 1) {
    std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
              ((vector<char,std::allocator<char>> *)target_buffer,
               (target_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish,(long)&uStack_18 + 4,&stack0xfffffffffffffff0);
    puVar1 = (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (target_buffer->bit_encoder_reserved_bytes_ < 1) {
      std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                ((vector<char,std::allocator<char>> *)target_buffer,
                 (target_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,puVar1,(uStack_18 >> 0x20) + (long)puVar1);
      puVar1 = (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
               .super__Vector_impl_data._M_start;
    }
  }
  if ((this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->bits_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  this->local_bits_ = 0;
  this->num_local_bits_ = 0;
  return;
}

Assistant:

void DirectBitEncoder::EndEncoding(EncoderBuffer *target_buffer) {
  bits_.push_back(local_bits_);
  const uint32_t size_in_byte = static_cast<uint32_t>(bits_.size()) * 4;
  target_buffer->Encode(size_in_byte);
  target_buffer->Encode(bits_.data(), size_in_byte);
  Clear();
}